

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

int Llb_ManCutLoNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  if (0 < (long)vMinCut->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      uVar3 = 0;
      if ((*(uint *)((long)vMinCut->pArray[lVar2] + 0x18) & 7) == 2) {
        uVar3 = (uint)(p->nTruePis <= *vMinCut->pArray[lVar2]);
      }
      iVar1 = iVar1 + uVar3;
      lVar2 = lVar2 + 1;
    } while (vMinCut->nSize != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int Llb_ManCutLoNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
        if ( Saig_ObjIsLo(p,pObj) )
            Counter++;
    return Counter;
}